

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::IsSystemIncludeDirectory(cmGeneratorTarget *this,string *dir,string *config)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  _Rb_tree_header *__last;
  pointer ppcVar1;
  cmMakefile *mf;
  cmTarget *this_01;
  cmGeneratorTarget *this_02;
  bool bVar2;
  iterator iVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *pvVar6;
  pointer ppcVar7;
  cmTarget *pcVar8;
  pointer path;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar9;
  allocator local_1ca;
  char local_1c9;
  cmGeneratorExpression local_1c8;
  cmGeneratorTarget *local_1c0;
  string *local_1b8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  value_type entry;
  string config_upper;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  local_1c0 = this;
  if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
    config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
    config_upper._M_string_length = 0;
    config_upper.field_2._M_local_buf[0] = '\0';
    local_1b8 = config;
    if (config->_M_string_length != 0) {
      cmsys::SystemTools::UpperCase((string *)&dagChecker,config);
      std::__cxx11::string::operator=((string *)&config_upper,(string *)&dagChecker);
      std::__cxx11::string::~string((string *)&dagChecker);
    }
    this_02 = local_1c0;
    this_00 = &local_1c0->SystemIncludesCache;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&this_00->_M_t,&config_upper);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this_02->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header) {
      GetName_abi_cxx11_(&entry.first,this_02);
      std::__cxx11::string::string
                ((string *)&unique,"SYSTEM_INCLUDE_DIRECTORIES",(allocator *)&result);
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                (&dagChecker,&entry.first,(string *)&unique,(GeneratorExpressionContent *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      std::__cxx11::string::~string((string *)&unique);
      std::__cxx11::string::~string((string *)&entry);
      pcVar8 = local_1c0->Target;
      std::__cxx11::string::string((string *)&entry,"NO_SYSTEM_FROM_IMPORTED",(allocator *)&unique);
      local_1c9 = cmTarget::GetPropertyAsBool(pcVar8,&entry.first);
      std::__cxx11::string::~string((string *)&entry);
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar8 = local_1c0->Target;
      p_Var5 = (pcVar8->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      while ((_Rb_tree_header *)p_Var5 !=
             &(pcVar8->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header) {
        cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
        cmGeneratorExpression::Parse(&local_1c8,(string *)&ge);
        unique._M_t._M_impl._0_8_ = &unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        unique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        unique._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        pcVar4 = cmCompiledGeneratorExpression::Evaluate
                           ((cmCompiledGeneratorExpression *)local_1c8.Backtrace,local_1c0->Makefile
                            ,local_1b8,false,local_1c0->Target,&dagChecker,(string *)&unique);
        std::__cxx11::string::string((string *)&entry,pcVar4,&local_1ca);
        cmSystemTools::ExpandListArgument(&entry.first,&result,false);
        std::__cxx11::string::~string((string *)&entry);
        std::__cxx11::string::~string((string *)&unique);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1c8);
        cmGeneratorExpression::~cmGeneratorExpression(&ge);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        pcVar8 = local_1c0->Target;
      }
      pvVar6 = cmTarget::GetLinkImplementationClosure(pcVar8,local_1b8);
      ppcVar1 = (pvVar6->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar7 = (pvVar6->
                     super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar1;
          ppcVar7 = ppcVar7 + 1) {
        pcVar8 = local_1c0->Target;
        mf = local_1c0->Makefile;
        this_01 = *ppcVar7;
        std::__cxx11::string::string
                  ((string *)&entry,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",(allocator *)&unique);
        pcVar4 = cmTarget::GetProperty(this_01,&entry.first);
        std::__cxx11::string::~string((string *)&entry);
        if (pcVar4 != (char *)0x0) {
          cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
          cmGeneratorExpression::Parse(&local_1c8,(char *)&ge);
          unique._M_t._M_impl._0_8_ = &unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          unique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          unique._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               ((ulong)unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
               0xffffffffffffff00);
          pcVar4 = cmCompiledGeneratorExpression::Evaluate
                             ((cmCompiledGeneratorExpression *)local_1c8.Backtrace,mf,local_1b8,
                              false,pcVar8,this_01,&dagChecker,(string *)&unique);
          std::__cxx11::string::string((string *)&entry,pcVar4,&local_1ca);
          cmSystemTools::ExpandListArgument(&entry.first,&result,false);
          std::__cxx11::string::~string((string *)&entry);
          std::__cxx11::string::~string((string *)&unique);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1c8);
          cmGeneratorExpression::~cmGeneratorExpression(&ge);
        }
        if (this_01->IsImportedTarget == true && local_1c9 == '\0') {
          std::__cxx11::string::string
                    ((string *)&entry,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&unique);
          pcVar4 = cmTarget::GetProperty(this_01,&entry.first);
          std::__cxx11::string::~string((string *)&entry);
          if (pcVar4 != (char *)0x0) {
            cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
            cmGeneratorExpression::Parse(&local_1c8,(char *)&ge);
            unique._M_t._M_impl._0_8_ =
                 &unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            unique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            unique._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 ((ulong)unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
                 0xffffffffffffff00);
            pcVar4 = cmCompiledGeneratorExpression::Evaluate
                               ((cmCompiledGeneratorExpression *)local_1c8.Backtrace,mf,local_1b8,
                                false,pcVar8,this_01,&dagChecker,(string *)&unique);
            std::__cxx11::string::string((string *)&entry,pcVar4,&local_1ca);
            cmSystemTools::ExpandListArgument(&entry.first,&result,false);
            std::__cxx11::string::~string((string *)&entry);
            std::__cxx11::string::~string((string *)&unique);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                      ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1c8);
            cmGeneratorExpression::~cmGeneratorExpression(&ge);
          }
        }
      }
      __last = &unique._M_t._M_impl.super__Rb_tree_header;
      unique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           unique._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      unique._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      path = result.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      unique._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
      unique._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
      for (; path != result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
        cmsys::SystemTools::ConvertToUnixSlashes(path);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&unique,path);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&result);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&result,
                 (const_iterator)
                 result.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )unique._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__last);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
                (&entry,&config_upper,&result);
      pVar9 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ::
              _M_emplace_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          *)this_00,&entry);
      iVar3._M_node = (_Base_ptr)pVar9.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair(&entry);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&unique._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&result);
      cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    }
    bVar2 = std::
            binary_search<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (iVar3._M_node + 2),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node[2]._M_parent,dir);
    std::__cxx11::string::~string((string *)&config_upper);
    return bVar2;
  }
  __assert_fail("this->GetType() != cmTarget::INTERFACE_LIBRARY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x20e,
                "bool cmGeneratorTarget::IsSystemIncludeDirectory(const std::string &, const std::string &) const"
               );
}

Assistant:

bool cmGeneratorTarget::IsSystemIncludeDirectory(const std::string& dir,
                                              const std::string& config) const
{
  assert(this->GetType() != cmTarget::INTERFACE_LIBRARY);
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }

  typedef std::map<std::string, std::vector<std::string> > IncludeCacheType;
  IncludeCacheType::const_iterator iter =
      this->SystemIncludesCache.find(config_upper);

  if (iter == this->SystemIncludesCache.end())
    {
    cmGeneratorExpressionDAGChecker dagChecker(
                                        this->GetName(),
                                        "SYSTEM_INCLUDE_DIRECTORIES", 0, 0);

    bool excludeImported
                = this->Target->GetPropertyAsBool("NO_SYSTEM_FROM_IMPORTED");

    std::vector<std::string> result;
    for (std::set<std::string>::const_iterator
        it = this->Target->GetSystemIncludeDirectories().begin();
        it != this->Target->GetSystemIncludeDirectories().end(); ++it)
      {
      cmGeneratorExpression ge;
      cmSystemTools::ExpandListArgument(ge.Parse(*it)
                                          ->Evaluate(this->Makefile,
                                          config, false, this->Target,
                                          &dagChecker), result);
      }

    std::vector<cmTarget const*> const& deps =
      this->Target->GetLinkImplementationClosure(config);
    for(std::vector<cmTarget const*>::const_iterator
          li = deps.begin(), le = deps.end(); li != le; ++li)
      {
      handleSystemIncludesDep(this->Makefile, *li, config, this->Target,
                              &dagChecker, result, excludeImported);
      }

    std::set<std::string> unique;
    for(std::vector<std::string>::iterator li = result.begin();
        li != result.end(); ++li)
      {
      cmSystemTools::ConvertToUnixSlashes(*li);
      unique.insert(*li);
      }
    result.clear();
    result.insert(result.end(), unique.begin(), unique.end());

    IncludeCacheType::value_type entry(config_upper, result);
    iter = this->SystemIncludesCache.insert(entry).first;
    }

  return std::binary_search(iter->second.begin(), iter->second.end(), dir);
}